

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O1

void __thiscall arangodb::velocypack::Builder::reserve(Builder *this,ValueLength len)

{
  Buffer<unsigned_char> *this_00;
  
  this_00 = this->_bufferPtr;
  if (this_00->_capacity <= this->_pos + len) {
    if (this_00->_capacity <= this_00->_size + len) {
      Buffer<unsigned_char>::grow(this_00,len);
    }
    this->_start = this->_bufferPtr->_buffer;
  }
  return;
}

Assistant:

void reserve(ValueLength len) {
    VELOCYPACK_ASSERT(_start == _bufferPtr->data());
    VELOCYPACK_ASSERT(_start + _pos >= _bufferPtr->data());
    VELOCYPACK_ASSERT(_start + _pos <= _bufferPtr->data() + _bufferPtr->size());

    // Reserves len bytes at pos of the current state (top of stack)
    // or throws an exception
    if (_pos + len < _bufferPtr->capacity()) {
      return;  // All OK, we can just increase tos->pos by len
    }

#ifndef VELOCYPACK_64BIT
    (void)checkOverflow(_pos + len);
#endif

    VELOCYPACK_ASSERT(_bufferPtr != nullptr);
    _bufferPtr->reserve(len);
    _start = _bufferPtr->data();
  }